

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# printer_data.c
# Opt level: O0

LY_ERR lyd_print_tree(ly_out *out,lyd_node *root,LYD_FORMAT format,uint32_t options)

{
  LY_ERR ret__;
  uint32_t options_local;
  LYD_FORMAT format_local;
  lyd_node *root_local;
  ly_out *out_local;
  
  if (out == (ly_out *)0x0) {
    ly_log((ly_ctx *)0x0,LY_LLERR,LY_EINVAL,"Invalid argument %s (%s()).","out","lyd_print_tree");
    out_local._4_4_ = LY_EINVAL;
  }
  else if ((options & 1) == 0) {
    out->func_printed = 0;
    out_local._4_4_ = lyd_print_(out,root,format,options);
    if (out_local._4_4_ == LY_SUCCESS) {
      out_local._4_4_ = LY_SUCCESS;
    }
  }
  else {
    ly_log((ly_ctx *)0x0,LY_LLERR,LY_EINVAL,"Invalid argument %s (%s()).","!(options & 0x01)",
           "lyd_print_tree");
    out_local._4_4_ = LY_EINVAL;
  }
  return out_local._4_4_;
}

Assistant:

LIBYANG_API_DEF LY_ERR
lyd_print_tree(struct ly_out *out, const struct lyd_node *root, LYD_FORMAT format, uint32_t options)
{
    LY_CHECK_ARG_RET(NULL, out, !(options & LYD_PRINT_WITHSIBLINGS), LY_EINVAL);

    /* reset the number of printed bytes */
    out->func_printed = 0;

    /* print the subtree */
    LY_CHECK_RET(lyd_print_(out, root, format, options));

    return LY_SUCCESS;
}